

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  yoml_t *node;
  undefined4 uVar1;
  __uid_t _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pid_t pVar6;
  int extraout_EAX;
  passwd *ppVar7;
  h2o_configurator_t *phVar8;
  ulong extraout_RAX;
  yoml_t *pyVar9;
  time_t tVar10;
  FILE *pFVar11;
  listener_config_t **pplVar12;
  bool bVar13;
  anon_struct_968_4_e2476a95 *paVar14;
  ulong uVar15;
  h2o_vector_t *vector;
  size_t __n;
  void *pvVar16;
  char **__s;
  ulong uVar17;
  char *__s1;
  SSL_CTX **contexts;
  char *pcVar18;
  size_t sVar19;
  char *pcVar20;
  size_t sVar21;
  undefined8 *puVar22;
  long lVar23;
  resolve_tag_node_cache_entry_t *prVar24;
  size_t sVar25;
  h2o_iovec_t hVar26;
  yoml_parse_args_t yStack_d8;
  option *poStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  ulong uStack_a0;
  char **local_98;
  code *pcStack_90;
  char *pcStack_88;
  resolve_tag_arg_t resolve_tag_arg;
  undefined1 auStack_68 [8];
  yoml_parse_args_t parse_args;
  int local_3c;
  int local_38;
  int pipefds [2];
  
  __s = &pcStack_88;
  resolve_tag_arg.node_cache.capacity = (size_t)*argv;
  pcStack_90 = (code *)0x18ad0b;
  pipefds[0] = argc;
  conf.num_threads = h2o_numproc();
  conf.tfo_queues = 0x1000;
  pcStack_90 = (code *)0x18ad2a;
  conf.launch_time = time((time_t *)0x0);
  h2o_hostinfo_max_threads = 0x20;
  pcStack_90 = (code *)0x18ad50;
  h2o_sem_init(&ocsp_updater_semaphore,10);
  pcStack_90 = (code *)0x18ad55;
  init_openssl();
  pcStack_90 = (code *)0x18ad5d;
  h2o_config_init(&conf.globalconf);
  pcStack_90 = (code *)0x18ad62;
  _Var2 = getuid();
  if (_Var2 == 0) {
    pcStack_90 = (code *)0x18ad75;
    ppVar7 = getpwnam("nobody");
    if (ppVar7 != (passwd *)0x0) {
      conf.globalconf.user = "nobody";
    }
  }
  pcStack_90 = (code *)0x18ad95;
  phVar8 = h2o_configurator_create(&conf.globalconf,0x40);
  phVar8->enter = on_config_listen_enter;
  phVar8->exit = on_config_listen_exit;
  pcStack_90 = (code *)0x18adc6;
  h2o_configurator_define_command(phVar8,"listen",3,on_config_listen);
  pcStack_90 = (code *)0x18add3;
  phVar8 = h2o_configurator_create(&conf.globalconf,0x40);
  pcStack_90 = (code *)0x18adf1;
  h2o_configurator_define_command(phVar8,"user",0x101,on_config_user);
  pcStack_90 = (code *)0x18ae0c;
  h2o_configurator_define_command(phVar8,"pid-file",0x101,on_config_pid_file);
  pcStack_90 = (code *)0x18ae27;
  h2o_configurator_define_command(phVar8,"error-log",0x101,on_config_error_log);
  pcStack_90 = (code *)0x18ae42;
  h2o_configurator_define_command(phVar8,"max-connections",1,on_config_max_connections);
  pcStack_90 = (code *)0x18ae5d;
  h2o_configurator_define_command(phVar8,"num-threads",1,on_config_num_threads);
  pcStack_90 = (code *)0x18ae78;
  h2o_configurator_define_command
            (phVar8,"num-name-resolution-threads",1,on_config_num_name_resolution_threads);
  pcStack_90 = (code *)0x18ae93;
  h2o_configurator_define_command(phVar8,"tcp-fastopen",1,on_config_tcp_fastopen);
  pcStack_90 = (code *)0x18aeae;
  h2o_configurator_define_command
            (phVar8,"ssl-session-resumption",0x401,ssl_session_resumption_on_config);
  pcStack_90 = (code *)0x18aec9;
  h2o_configurator_define_command(phVar8,"num-ocsp-updaters",0x101,on_config_num_ocsp_updaters);
  pcStack_90 = (code *)0x18aee4;
  h2o_configurator_define_command(phVar8,"temp-buffer-path",0x101,on_config_temp_buffer_path);
  pcStack_90 = (code *)0x18aeff;
  h2o_configurator_define_command(phVar8,"crash-handler",0x101,on_config_crash_handler);
  pcStack_90 = (code *)0x18af1a;
  h2o_configurator_define_command
            (phVar8,"crash-handler.wait-pipe-close",0x101,on_config_crash_handler_wait_pipe_close);
  pcStack_90 = (code *)0x18af22;
  h2o_access_log_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af2a;
  h2o_compress_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af32;
  h2o_expires_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af3a;
  h2o_errordoc_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af42;
  h2o_fastcgi_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af4a;
  h2o_file_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af52;
  h2o_throttle_resp_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af5a;
  h2o_headers_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af62;
  h2o_proxy_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af6a;
  h2o_reproxy_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af72;
  h2o_redirect_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af7a;
  h2o_status_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af82;
  h2o_http2_debug_state_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18af9d;
  hVar26.len = 4;
  hVar26.base = "main";
  h2o_config_register_simple_status_handler(&conf.globalconf,hVar26,on_extra_status);
  pcVar20 = "etc/h2o.conf";
LAB_0018afb2:
  uVar15 = (ulong)(uint)pipefds[0];
LAB_0018afb6:
  do {
    while( true ) {
      pcStack_90 = (code *)0x18afca;
      iVar3 = getopt_long(uVar15,argv,"c:m:tvh",main::longopts,0);
      pcVar18 = _optarg;
      if (0x6c < iVar3) break;
      if (iVar3 < 0x3f) {
        if (iVar3 == -1) {
          pcStack_90 = (code *)0x18b0d6;
          conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds);
          __s = &pcStack_88;
          if (conf.server_starter.num_fds != 0xffffffffffffffff) {
            __s = &pcStack_88;
            if (conf.server_starter.fds != (int *)0x0) {
              __n = 0;
              if (conf.server_starter.num_fds != 0) {
                do {
                  pcStack_90 = (code *)0x18b107;
                  set_cloexec(conf.server_starter.fds[__n]);
                  __n = __n + 1;
                } while (__n != conf.server_starter.num_fds);
              }
              lVar23 = -(__n + 0xf & 0xfffffffffffffff0);
              __s = (char **)((long)&pcStack_88 + lVar23);
              *(undefined8 *)((long)&pcStack_90 + lVar23) = 0x18b135;
              conf.server_starter.bound_fd_map = (char *)__s;
              memset(__s,0,__n);
              *(undefined8 *)((long)&pcStack_90 + lVar23) = 0x18b141;
              conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
            }
            *(char *)((long)__s + -8) = 'T';
            *(char *)((long)__s + -7) = -0x4f;
            *(char *)((long)__s + -6) = '\x18';
            *(char *)((long)__s + -5) = '\0';
            *(char *)((long)__s + -4) = '\0';
            *(char *)((long)__s + -3) = '\0';
            *(char *)((long)__s + -2) = '\0';
            *(char *)((long)__s + -1) = '\0';
            unsetenv("SERVER_STARTER_PORT");
            parse_args.resolve_tag.cb = (_func_yoml_t_ptr_char_ptr_yoml_t_ptr_void_ptr *)&pcStack_88
            ;
            resolve_tag_arg.node_cache.size = 0;
            pcStack_88 = (char *)0x0;
            resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
            auStack_68._0_4_ = SUB84(pcVar20,0);
            auStack_68._4_4_ = (undefined4)((ulong)pcVar20 >> 0x20);
            parse_args.filename._0_4_ = 0;
            parse_args.filename._4_4_ = 0;
            parse_args.mem_set._0_4_ = 0x18b815;
            parse_args.mem_set._4_4_ = 0;
            *(char *)((long)__s + -8) = -0x7b;
            *(char *)((long)__s + -7) = -0x4f;
            *(char *)((long)__s + -6) = '\x18';
            *(char *)((long)__s + -5) = '\0';
            *(char *)((long)__s + -4) = '\0';
            *(char *)((long)__s + -3) = '\0';
            *(char *)((long)__s + -2) = '\0';
            *(char *)((long)__s + -1) = '\0';
            pyVar9 = load_config((yoml_parse_args_t *)auStack_68,(yoml_t *)0x0);
            if (pyVar9 != (yoml_t *)0x0) {
              *(char *)((long)__s + -8) = -0x54;
              *(char *)((long)__s + -7) = -0x4f;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              iVar3 = h2o_configurator_apply
                                (&conf.globalconf,pyVar9,(uint)(conf.run_mode != RUN_MODE_WORKER));
              if (iVar3 != 0) goto LAB_0018b7a5;
              if (resolve_tag_arg.node_cache.entries != (resolve_tag_node_cache_entry_t *)0x0) {
                lVar23 = 0x10;
                prVar24 = (resolve_tag_node_cache_entry_t *)0x0;
                do {
                  pcVar18 = pcStack_88;
                  pvVar16 = *(void **)(pcStack_88 + lVar23 + -0x10);
                  builtin_strncpy((char *)((long)__s + -8),"ұ\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  free(pvVar16);
                  node = *(yoml_t **)(pcVar18 + lVar23);
                  builtin_strncpy((char *)((long)__s + -8),"ݱ\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  yoml_free(node,(_func_void_ptr_void_ptr_int_size_t *)0x0);
                  prVar24 = (resolve_tag_node_cache_entry_t *)((long)&(prVar24->filename).base + 1);
                  lVar23 = lVar23 + 0x18;
                } while (prVar24 != resolve_tag_arg.node_cache.entries);
              }
              pcVar18 = pcStack_88;
              *(char *)((long)__s + -8) = -0xd;
              *(char *)((long)__s + -7) = -0x4f;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              free(pcVar18);
              *(char *)((long)__s + -8) = -3;
              *(char *)((long)__s + -7) = -0x4f;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              yoml_free(pyVar9,(_func_void_ptr_void_ptr_int_size_t *)0x0);
              conf.globalconf.filecache.capacity =
                   conf.globalconf.http2.max_concurrent_requests_per_connection * 2;
              if (conf.server_starter.num_fds != 0 && conf.server_starter.fds != (int *)0x0) {
                bVar13 = false;
                sVar19 = 0;
                do {
                  while (sVar25 = sVar19 + 1, conf.server_starter.bound_fd_map[sVar19] == '\0') {
                    uVar4 = conf.server_starter.fds[sVar19];
                    *(char *)((long)__s + -8) = '}';
                    *(char *)((long)__s + -7) = -0x4e;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fprintf(_stderr,
                            "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n",
                            (ulong)uVar4);
                    bVar13 = true;
                    sVar19 = sVar25;
                    if (conf.server_starter.num_fds == sVar25) {
LAB_0018b3ea:
                      *(char *)((long)__s + -8) = -0x11;
                      *(char *)((long)__s + -7) = -0x4d;
                      *(char *)((long)__s + -6) = '\x18';
                      *(char *)((long)__s + -5) = '\0';
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      main_cold_3();
                      return 0x4e;
                    }
                  }
                  sVar19 = sVar25;
                } while (sVar25 != conf.server_starter.num_fds);
                if (bVar13) goto LAB_0018b3ea;
              }
              *(char *)((long)__s + -8) = -0x60;
              *(char *)((long)__s + -7) = -0x4e;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              tVar10 = time((time_t *)0x0);
              *(char *)((long)__s + -8) = -0x58;
              *(char *)((long)__s + -7) = -0x4e;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              uVar4 = getpid();
              *(char *)((long)__s + -8) = -0x4f;
              *(char *)((long)__s + -7) = -0x4e;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              srand((uint)tVar10 ^ uVar4);
              sVar19 = resolve_tag_arg.node_cache.capacity;
              if (conf.run_mode == RUN_MODE_MASTER) {
LAB_0018b2d4:
                *(char *)((long)__s + -8) = -0x20;
                *(char *)((long)__s + -7) = -0x4e;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                run_using_server_starter((char *)sVar19,pcVar20);
                return 0x4e;
              }
              if (conf.run_mode == RUN_MODE_TEST) {
                *(char *)((long)__s + -8) = -10;
                *(char *)((long)__s + -7) = -0x4e;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                puts("configuration OK");
                return 0;
              }
              if (conf.run_mode == RUN_MODE_DAEMON) {
                if (conf.error_log == (char *)0x0) {
                  *(char *)((long)__s + -8) = -7;
                  *(char *)((long)__s + -7) = -0x4d;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  main_cold_4();
                  return 0x4e;
                }
                goto LAB_0018b2d4;
              }
              *(char *)((long)__s + -8) = '\t';
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              pcVar20 = getenv("H2O_VIA_MASTER");
              if (pcVar20 != (char *)0x0) {
                conf.pid_file = (char *)0x0;
                conf.error_log = (char *)0x0;
              }
              *(char *)((long)__s + -8) = '&';
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              iVar3 = getrlimit(RLIMIT_NOFILE,(rlimit *)auStack_68);
              if (iVar3 == 0) {
                auStack_68._0_4_ = (int)parse_args.filename;
                auStack_68._4_4_ = parse_args.filename._4_4_;
                *(char *)((long)__s + -8) = '?';
                *(char *)((long)__s + -7) = -0x4d;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar3 = setrlimit(RLIMIT_NOFILE,(rlimit *)auStack_68);
                if (iVar3 == 0) {
                  *(char *)((long)__s + -8) = 'N';
                  *(char *)((long)__s + -7) = -0x4b;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  main_cold_5();
                }
              }
              *(char *)((long)__s + -8) = 'X';
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(0xf,on_sigterm);
              *(char *)((long)__s + -8) = 'g';
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(0xd,(_func_void_int *)0x1);
              *(char *)((long)__s + -8) = 's';
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              pcVar20 = h2o_configurator_get_cmd_path(conf.crash_handler);
              resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
              pcStack_88 = pcVar20;
              *(char *)((long)__s + -8) = -0x75;
              *(char *)((long)__s + -7) = -0x4d;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              iVar5 = pipe(&local_3c);
              iVar3 = local_38;
              if (iVar5 == 0) {
                *(char *)((long)__s + -8) = -0x5d;
                *(char *)((long)__s + -7) = -0x4d;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar3 = fcntl(iVar3,2,1);
                if (iVar3 == -1) {
                  pcVar20 = "failed to set FD_CLOEXEC on pipefds[1]";
                  goto LAB_0018b40e;
                }
                auStack_68._0_4_ = local_3c;
                auStack_68._4_4_ = 0;
                parse_args.filename._0_4_ = 2;
                parse_args.filename._4_4_ = 1;
                parse_args.mem_set._0_4_ = 0xffffffff;
                builtin_strncpy((char *)((long)__s + -8),"ʳ\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pVar6 = h2o_spawnp(pcVar20,&pcStack_88,(int *)auStack_68,0);
                builtin_strncpy((char *)((long)__s + -8),"Գ\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                close(local_3c);
                if (pVar6 == -1) {
                  *(char *)((long)__s + -8) = -0x18;
                  *(char *)((long)__s + -7) = -0x4d;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  close(local_38);
                  goto LAB_0018b413;
                }
                crash_handler_fd = local_38;
                if (local_38 == -1) goto LAB_0018b413;
              }
              else {
                pcVar20 = "pipe failed";
LAB_0018b40e:
                *(char *)((long)__s + -8) = '\x13';
                *(char *)((long)__s + -7) = -0x4c;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                perror(pcVar20);
LAB_0018b413:
                crash_handler_fd = 2;
              }
              *(char *)((long)__s + -8) = '2';
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(6,on_sigfatal);
              *(char *)((long)__s + -8) = '?';
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(7,on_sigfatal);
              *(char *)((long)__s + -8) = 'L';
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(8,on_sigfatal);
              *(char *)((long)__s + -8) = 'Y';
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(4,on_sigfatal);
              *(char *)((long)__s + -8) = 'f';
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              h2o_set_signal_handler(0xb,on_sigfatal);
              if (conf.error_log == (char *)0x0) {
                iVar3 = -1;
              }
              else {
                *(char *)((long)__s + -8) = 'w';
                *(char *)((long)__s + -7) = -0x4c;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar3 = h2o_access_log_open_log(conf.error_log);
                if (iVar3 == -1) {
                  return 0x4e;
                }
              }
              *(char *)((long)__s + -8) = -0x51;
              *(char *)((long)__s + -7) = -0x4c;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              setvbuf(_stdout,(char *)0x0,1,0);
              builtin_strncpy((char *)((long)__s + -8),"Ǵ\x18",4);
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              setvbuf(_stderr,(char *)0x0,1,0);
              if (conf.globalconf.user == (char *)0x0) {
                builtin_strncpy((char *)((long)__s + -8),"ش\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                _Var2 = getuid();
                if (_Var2 == 0) {
                  *(char *)((long)__s + -8) = -0x1f;
                  *(char *)((long)__s + -7) = -0x4c;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  main_cold_9();
                  return 0x4e;
                }
              }
              else {
                *(char *)((long)__s + -8) = -0x15;
                *(char *)((long)__s + -7) = -0x4c;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar5 = h2o_setuidgid(conf.globalconf.user);
                if (iVar5 != 0) {
                  *(char *)((long)__s + -8) = '@';
                  *(char *)((long)__s + -7) = -0x4b;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  main_cold_6();
                  return 0x47;
                }
                if (neverbleed != (neverbleed_t *)0x0) {
                  *(char *)((long)__s + -8) = '\f';
                  *(char *)((long)__s + -7) = -0x4b;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar5 = neverbleed_setuidgid(neverbleed,conf.globalconf.user,1);
                  if (iVar5 != 0) {
                    *(char *)((long)__s + -8) = -4;
                    *(char *)((long)__s + -7) = -0x4a;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_7();
                    return 0x47;
                  }
                }
              }
              if (conf.pid_file != (char *)0x0) {
                *(char *)((long)__s + -8) = ',';
                *(char *)((long)__s + -7) = -0x4b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pFVar11 = fopen(conf.pid_file,"wt");
                if (pFVar11 == (FILE *)0x0) {
                  *(char *)((long)__s + -8) = '6';
                  *(char *)((long)__s + -7) = -0x4b;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  main_cold_8();
                  return 0x47;
                }
                *(char *)((long)__s + -8) = '[';
                *(char *)((long)__s + -7) = -0x4b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar4 = getpid();
                *(char *)((long)__s + -8) = 'n';
                *(char *)((long)__s + -7) = -0x4b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                fprintf(pFVar11,"%d\n",(ulong)uVar4);
                *(char *)((long)__s + -8) = 'v';
                *(char *)((long)__s + -7) = -0x4b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                fclose(pFVar11);
              }
              auStack_68._0_4_ = 0;
              auStack_68._4_4_ = 0;
              parse_args.filename._0_4_ = 0;
              parse_args.filename._4_4_ = 0;
              parse_args.mem_set._0_4_ = 0;
              parse_args.mem_set._4_4_ = 0;
              uVar15 = 0;
              contexts = (SSL_CTX **)0x0;
              if (conf.num_listeners != 0) {
                uVar15 = 0;
                sVar25 = 0;
                pplVar12 = conf.listeners;
                sVar19 = conf.num_listeners;
                do {
                  if ((pplVar12[sVar25]->ssl).size != 0) {
                    sVar21 = 0;
                    uVar17 = uVar15;
                    do {
                      uVar15 = uVar17 + 1;
                      if (CONCAT44(parse_args.mem_set._4_4_,parse_args.mem_set._0_4_) < uVar15) {
                        builtin_strncpy((char *)((long)__s + -8),"ֵ\x18",4);
                        *(char *)((long)__s + -4) = '\0';
                        *(char *)((long)__s + -3) = '\0';
                        *(char *)((long)__s + -2) = '\0';
                        *(char *)((long)__s + -1) = '\0';
                        h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)auStack_68,8,uVar15
                                          );
                        uVar17 = CONCAT44(parse_args.filename._4_4_,(int)parse_args.filename);
                        uVar15 = uVar17 + 1;
                        pplVar12 = conf.listeners;
                      }
                      parse_args.filename._0_4_ = (int)uVar15;
                      parse_args.filename._4_4_ = (undefined4)(uVar15 >> 0x20);
                      *(SSL_CTX **)(CONCAT44(auStack_68._4_4_,auStack_68._0_4_) + uVar17 * 8) =
                           (pplVar12[sVar25]->ssl).entries[sVar21]->ctx;
                      sVar21 = sVar21 + 1;
                      pplVar12 = conf.listeners;
                      sVar19 = conf.num_listeners;
                      uVar17 = uVar15;
                    } while (sVar21 != (conf.listeners[sVar25]->ssl).size);
                  }
                  sVar25 = sVar25 + 1;
                } while (sVar25 != sVar19);
                contexts = (SSL_CTX **)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
              }
              *(char *)((long)__s + -8) = '=';
              *(char *)((long)__s + -7) = -0x4a;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              ssl_setup_session_resumption(contexts,uVar15);
              pvVar16 = (void *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
              *(char *)((long)__s + -8) = 'I';
              *(char *)((long)__s + -7) = -0x4a;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              free(pvVar16);
              *(char *)((long)__s + -8) = 'Q';
              *(char *)((long)__s + -7) = -0x4a;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              iVar5 = pipe((int *)auStack_68);
              uVar1 = auStack_68._4_4_;
              if (iVar5 == 0) {
                *(char *)((long)__s + -8) = ']';
                *(char *)((long)__s + -7) = -0x4a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                close(uVar1);
                uVar1 = auStack_68._0_4_;
                *(char *)((long)__s + -8) = 'g';
                *(char *)((long)__s + -7) = -0x4a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                dup2(uVar1,0);
                uVar1 = auStack_68._0_4_;
                *(char *)((long)__s + -8) = 'o';
                *(char *)((long)__s + -7) = -0x4a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                close(uVar1);
                if (iVar3 == -1) {
LAB_0018b674:
                  pFVar11 = _stderr;
                  *(char *)((long)__s + -8) = '|';
                  *(char *)((long)__s + -7) = -0x4a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar4 = getpid();
                  *(char *)((long)__s + -8) = -0x71;
                  *(char *)((long)__s + -7) = -0x4a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fprintf(pFVar11,"h2o server (pid:%d) is ready to serve requests\n",(ulong)uVar4);
                  if (conf.num_threads != 0) {
                    paVar14 = (anon_struct_968_4_e2476a95 *)
                              ((long)__s + -(conf.num_threads * 0x3c8 + 0xf & 0xfffffffffffffff0));
                    paVar14[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18b731;
                    conf.threads = paVar14;
                    h2o_barrier_init(&conf.startup_sync_barrier,conf.num_threads);
                    if (conf.num_threads != 1) {
                      pvVar16 = (void *)0x1;
                      do {
                        paVar14[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18b75b;
                        h2o_multithread_create_thread
                                  ((pthread_t *)auStack_68,(pthread_attr_t *)0x0,run_loop,pvVar16);
                        pvVar16 = (void *)((long)pvVar16 + 1);
                      } while (pvVar16 != (void *)conf.num_threads);
                    }
                    paVar14[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18b76e;
                    run_loop((void *)0x0);
                  }
                  *(char *)((long)__s + -8) = -0x46;
                  *(char *)((long)__s + -7) = -0x4a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  __assert_fail("conf.num_threads != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                                ,0x8af,"int main(int, char **)");
                }
                builtin_strncpy((char *)((long)__s + -8),"϶\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar5 = dup2(iVar3,1);
                if (iVar5 != -1) {
                  *(char *)((long)__s + -8) = -0x20;
                  *(char *)((long)__s + -7) = -0x4a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar5 = dup2(iVar3,2);
                  if (iVar5 != -1) {
                    *(char *)((long)__s + -8) = 'u';
                    *(char *)((long)__s + -7) = -0x49;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    close(iVar3);
                    goto LAB_0018b674;
                  }
                }
                pcVar20 = "dup(2) failed";
              }
              else {
                pcVar20 = "pipe failed";
              }
              *(char *)((long)__s + -8) = -0xb;
              *(char *)((long)__s + -7) = -0x4a;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              perror(pcVar20);
              return 0x47;
            }
          }
        }
        else if (iVar3 != 0x3a) goto LAB_0018b7d3;
LAB_0018b7a5:
        *(undefined8 *)((long)__s + -8) = 0x18b7af;
        exit(0x4e);
      }
      pcVar20 = _optarg;
      if (iVar3 != 99) {
        __s = &pcStack_88;
        if (iVar3 != 0x3f) {
          if (iVar3 == 0x68) {
            pcVar18 = 
            "h2o version 2.2.5\n\nUsage:\n  h2o [options]\n\nOptions:\n  -c, --conf FILE    configuration file (default: %s)\n  -m, --mode <mode>  specifies one of the following mode\n                     - worker: invoked process handles incoming connections\n                               (default)\n                     - daemon: spawns a master process and exits. `error-log`\n                               must be configured when using this mode, as all\n                               the errors are logged to the file instead of\n                               being emitted to STDERR\n                     - master: invoked process becomes a master process (using\n                               the `share/h2o/start_server` command) and spawns\n                               a worker process for handling incoming\n                               connections. Users may send SIGHUP to the master\n                               process to reconfigure or upgrade the server.\n                     - test:   tests the configuration and exits\n  -t, --test         synonym of `--mode=test`\n  -v, --version      prints the version number\n  -h, --help         print this help\n\nPlease refer to the documentation under `share/doc/h2o` (or available online at\nhttp://h2o.examp1e.net/) for how to configure the server.\n\n"
            ;
            pcVar20 = "etc/h2o.conf";
LAB_0018b792:
            pcStack_90 = (code *)0x18b799;
            printf(pcVar18,pcVar20);
            pcStack_90 = (code *)0x18b7a0;
            exit(0);
          }
LAB_0018b7d3:
          pcStack_90 = (code *)0x18b7f2;
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                        ,0x802,"int main(int, char **)");
        }
        goto LAB_0018b7a5;
      }
    }
    if (iVar3 == 0x6d) {
      pcStack_90 = (code *)0x18b020;
      iVar3 = strcmp(_optarg,"worker");
      if (iVar3 == 0) {
        conf.run_mode = RUN_MODE_WORKER;
      }
      else {
        pcStack_90 = (code *)0x18b033;
        iVar3 = strcmp(pcVar18,"master");
        if (iVar3 == 0) {
          conf.run_mode = RUN_MODE_MASTER;
LAB_0018b07f:
          uVar15 = (ulong)(uint)pipefds[0];
          goto LAB_0018b089;
        }
        pcStack_90 = (code *)0x18b046;
        iVar3 = strcmp(pcVar18,"daemon");
        if (iVar3 == 0) {
          conf.run_mode = RUN_MODE_DAEMON;
          goto LAB_0018b07f;
        }
        pcStack_90 = (code *)0x18b059;
        iVar3 = strcmp(pcVar18,"test");
        if (iVar3 != 0) break;
        conf.run_mode = RUN_MODE_TEST;
      }
      goto LAB_0018afb2;
    }
    if (iVar3 != 0x74) {
      if (iVar3 == 0x76) {
        pcStack_90 = (code *)0x18b7c0;
        puts("h2o version 2.2.5");
        pcStack_90 = (code *)0x18b7c7;
        pcVar20 = (char *)OpenSSL_version(0);
        pcVar18 = "OpenSSL: %s\n";
        goto LAB_0018b792;
      }
      goto LAB_0018b7d3;
    }
    conf.run_mode = RUN_MODE_TEST;
  } while( true );
  pcStack_90 = (code *)0x18b065;
  main_cold_1();
  uVar15 = (ulong)(uint)pipefds[0];
  if ((extraout_RAX & 1) != 0) {
LAB_0018b089:
    __s1 = "SERVER_STARTER_PORT";
    pcStack_90 = (code *)0x18b095;
    pcVar18 = getenv("SERVER_STARTER_PORT");
    if (pcVar18 != (char *)0x0) {
      pcStack_90 = set_cloexec;
      main_cold_2();
      pyVar9 = (yoml_t *)0x2;
      local_98 = (char **)0x18b809;
      pcStack_90._0_4_ = extraout_EAX;
      iVar3 = fcntl((int)__s1,2,1);
      if (iVar3 != -1) {
        return (int)pcStack_90;
      }
      local_98 = (char **)resolve_tag;
      set_cloexec_cold_1();
      pcStack_b0 = "c:m:tvh";
      poStack_b8 = main::longopts;
      pcStack_a8 = pcVar20;
      uStack_a0 = uVar15;
      local_98 = argv;
      iVar3 = strcmp(__s1,"!file");
      if (iVar3 != 0) goto LAB_0018b838;
      if (pyVar9->type != YOML_TYPE_SCALAR) {
        resolve_tag_cold_1();
        pyVar9 = (yoml_t *)0x0;
        goto LAB_0018b83c;
      }
      pcVar20 = (pyVar9->data).scalar;
      sVar19 = vector->size;
      if (sVar19 == 0) goto LAB_0018b887;
      puVar22 = (undefined8 *)((long)vector->entries + 0x10);
      goto LAB_0018b86a;
    }
  }
  goto LAB_0018afb6;
  while( true ) {
    puVar22 = puVar22 + 3;
    sVar19 = sVar19 - 1;
    if (sVar19 == 0) break;
LAB_0018b86a:
    iVar3 = strcmp(pcVar20,(char *)puVar22[-2]);
    if (iVar3 == 0) {
      pyVar9 = (yoml_t *)*puVar22;
      goto LAB_0018b838;
    }
  }
LAB_0018b887:
  yStack_d8.mem_set = (_func_void_ptr_void_ptr_int_size_t *)0x0;
  yStack_d8.resolve_tag.cb = resolve_tag;
  yStack_d8.filename = pcVar20;
  pyVar9 = load_config(&yStack_d8,pyVar9);
  if (pyVar9 != (yoml_t *)0x0) {
    uVar15 = vector->size + 1;
    if (vector->capacity < uVar15) {
      h2o_vector__expand((h2o_mem_pool_t *)0x0,vector,0x18,uVar15);
    }
    hVar26 = h2o_strdup((h2o_mem_pool_t *)0x0,pcVar20,0xffffffffffffffff);
    pvVar16 = vector->entries;
    sVar19 = vector->size;
    vector->size = sVar19 + 1;
    *(char **)((long)pvVar16 + sVar19 * 0x18) = hVar26.base;
    *(size_t *)((long)pvVar16 + sVar19 * 0x18 + 8) = hVar26.len;
    *(yoml_t **)((long)pvVar16 + sVar19 * 0x18 + 0x10) = pyVar9;
LAB_0018b838:
    pyVar9->_refcnt = pyVar9->_refcnt + 1;
  }
LAB_0018b83c:
  return (int)pyVar9;
}

Assistant:

int main(int argc, char **argv)
{
    const char *cmd = argv[0], *opt_config_file = H2O_TO_STR(H2O_CONFIG_PATH);
    int error_log_fd = -1;

    conf.num_threads = h2o_numproc();
    conf.tfo_queues = H2O_DEFAULT_LENGTH_TCP_FASTOPEN_QUEUE;
    conf.launch_time = time(NULL);

    h2o_hostinfo_max_threads = H2O_DEFAULT_NUM_NAME_RESOLUTION_THREADS;

    h2o_sem_init(&ocsp_updater_semaphore, H2O_DEFAULT_OCSP_UPDATER_MAX_THREADS);

    init_openssl();
    setup_configurators();

    { /* parse options */
        int ch;
        static struct option longopts[] = {{"conf", required_argument, NULL, 'c'}, {"mode", required_argument, NULL, 'm'},
                                           {"test", no_argument, NULL, 't'},       {"version", no_argument, NULL, 'v'},
                                           {"help", no_argument, NULL, 'h'},       {NULL}};
        while ((ch = getopt_long(argc, argv, "c:m:tvh", longopts, NULL)) != -1) {
            switch (ch) {
            case 'c':
                opt_config_file = optarg;
                break;
            case 'm':
                if (strcmp(optarg, "worker") == 0) {
                    conf.run_mode = RUN_MODE_WORKER;
                } else if (strcmp(optarg, "master") == 0) {
                    conf.run_mode = RUN_MODE_MASTER;
                } else if (strcmp(optarg, "daemon") == 0) {
                    conf.run_mode = RUN_MODE_DAEMON;
                } else if (strcmp(optarg, "test") == 0) {
                    conf.run_mode = RUN_MODE_TEST;
                } else {
                    fprintf(stderr, "unknown mode:%s\n", optarg);
                }
                switch (conf.run_mode) {
                case RUN_MODE_MASTER:
                case RUN_MODE_DAEMON:
                    if (getenv("SERVER_STARTER_PORT") != NULL) {
                        fprintf(stderr, "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n",
                                optarg);
                        exit(EX_SOFTWARE);
                    }
                    break;
                default:
                    break;
                }
                break;
            case 't':
                conf.run_mode = RUN_MODE_TEST;
                break;
            case 'v':
                printf("h2o version " H2O_VERSION "\n");
                printf("OpenSSL: %s\n", SSLeay_version(SSLEAY_VERSION));
#if H2O_USE_MRUBY
                printf(
                    "mruby: YES\n"); /* TODO determine the way to obtain the version of mruby (that is being linked dynamically) */
#endif
                exit(0);
            case 'h':
                printf("h2o version " H2O_VERSION "\n"
                       "\n"
                       "Usage:\n"
                       "  h2o [options]\n"
                       "\n"
                       "Options:\n"
                       "  -c, --conf FILE    configuration file (default: %s)\n"
                       "  -m, --mode <mode>  specifies one of the following mode\n"
                       "                     - worker: invoked process handles incoming connections\n"
                       "                               (default)\n"
                       "                     - daemon: spawns a master process and exits. `error-log`\n"
                       "                               must be configured when using this mode, as all\n"
                       "                               the errors are logged to the file instead of\n"
                       "                               being emitted to STDERR\n"
                       "                     - master: invoked process becomes a master process (using\n"
                       "                               the `share/h2o/start_server` command) and spawns\n"
                       "                               a worker process for handling incoming\n"
                       "                               connections. Users may send SIGHUP to the master\n"
                       "                               process to reconfigure or upgrade the server.\n"
                       "                     - test:   tests the configuration and exits\n"
                       "  -t, --test         synonym of `--mode=test`\n"
                       "  -v, --version      prints the version number\n"
                       "  -h, --help         print this help\n"
                       "\n"
                       "Please refer to the documentation under `share/doc/h2o` (or available online at\n"
                       "http://h2o.examp1e.net/) for how to configure the server.\n"
                       "\n",
                       H2O_TO_STR(H2O_CONFIG_PATH));
                exit(0);
                break;
            case ':':
            case '?':
                exit(EX_CONFIG);
            default:
                assert(0);
                break;
            }
        }
        argc -= optind;
        argv += optind;
    }

    /* setup conf.server_starter */
    if ((conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds)) == SIZE_MAX)
        exit(EX_CONFIG);
    if (conf.server_starter.fds != 0) {
        size_t i;
        for (i = 0; i != conf.server_starter.num_fds; ++i)
            set_cloexec(conf.server_starter.fds[i]);
        conf.server_starter.bound_fd_map = alloca(conf.server_starter.num_fds);
        memset(conf.server_starter.bound_fd_map, 0, conf.server_starter.num_fds);
        conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
    }
    unsetenv("SERVER_STARTER_PORT");

    { /* configure */
        yoml_t *yoml;
        resolve_tag_arg_t resolve_tag_arg = {{NULL}};
        yoml_parse_args_t parse_args = {
            opt_config_file,                /* filename */
            NULL,                           /* mem_set */
            {resolve_tag, &resolve_tag_arg} /* resolve_tag */
        };
        if ((yoml = load_config(&parse_args, NULL)) == NULL)
            exit(EX_CONFIG);
        if (h2o_configurator_apply(&conf.globalconf, yoml, conf.run_mode != RUN_MODE_WORKER) != 0)
            exit(EX_CONFIG);

        dispose_resolve_tag_arg(&resolve_tag_arg);
        yoml_free(yoml, NULL);
    }
    /* calculate defaults (note: open file cached is purged once every loop) */
    conf.globalconf.filecache.capacity = conf.globalconf.http2.max_concurrent_requests_per_connection * 2;

    /* check if all the fds passed in by server::starter were bound */
    if (conf.server_starter.fds != NULL) {
        size_t i;
        int all_were_bound = 1;
        for (i = 0; i != conf.server_starter.num_fds; ++i) {
            if (!conf.server_starter.bound_fd_map[i]) {
                fprintf(stderr, "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n", conf.server_starter.fds[i]);
                all_were_bound = 0;
            }
        }
        if (!all_were_bound) {
            fprintf(stderr, "note: $SERVER_STARTER_PORT was \"%s\"\n", conf.server_starter.env_var);
            return EX_CONFIG;
        }
    }

    h2o_srand();
    /* handle run_mode == MASTER|TEST */
    switch (conf.run_mode) {
    case RUN_MODE_WORKER:
        break;
    case RUN_MODE_DAEMON:
        if (conf.error_log == NULL) {
            fprintf(stderr, "to run in `daemon` mode, `error-log` must be specified in the configuration file\n");
            return EX_CONFIG;
        }
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_MASTER:
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_TEST:
        printf("configuration OK\n");
        return 0;
    }

    if (getenv("H2O_VIA_MASTER") != NULL) {
        /* pid_file and error_log are the directives that are handled by the master process (invoking start_server) */
        conf.pid_file = NULL;
        conf.error_log = NULL;
    }

    { /* raise RLIMIT_NOFILE */
        struct rlimit limit;
        if (getrlimit(RLIMIT_NOFILE, &limit) == 0) {
            limit.rlim_cur = limit.rlim_max;
            if (setrlimit(RLIMIT_NOFILE, &limit) == 0
#ifdef __APPLE__
                || (limit.rlim_cur = OPEN_MAX, setrlimit(RLIMIT_NOFILE, &limit)) == 0
#endif
                ) {
                fprintf(stderr, "[INFO] raised RLIMIT_NOFILE to %d\n", (int)limit.rlim_cur);
            }
        }
    }

    setup_signal_handlers();

    /* open the log file to redirect STDIN/STDERR to, before calling setuid */
    if (conf.error_log != NULL) {
        if ((error_log_fd = h2o_access_log_open_log(conf.error_log)) == -1)
            return EX_CONFIG;
    }
    setvbuf(stdout, NULL, _IOLBF, 0);
    setvbuf(stderr, NULL, _IOLBF, 0);

    /* setuid */
    if (conf.globalconf.user != NULL) {
        if (h2o_setuidgid(conf.globalconf.user) != 0) {
            fprintf(stderr, "failed to change the running user (are you sure you are running as root?)\n");
            return EX_OSERR;
        }
        if (neverbleed != NULL && neverbleed_setuidgid(neverbleed, conf.globalconf.user, 1) != 0) {
            fprintf(stderr, "failed to change the running user of neverbleed daemon\n");
            return EX_OSERR;
        }
    } else {
        if (getuid() == 0) {
            fprintf(stderr, "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set "
                            "the running user\n");
            return EX_CONFIG;
        }
    }

    /* pid file must be written after setuid, since we need to remove it  */
    if (conf.pid_file != NULL) {
        FILE *fp = fopen(conf.pid_file, "wt");
        if (fp == NULL) {
            fprintf(stderr, "failed to open pid file:%s:%s\n", conf.pid_file, strerror(errno));
            return EX_OSERR;
        }
        fprintf(fp, "%d\n", (int)getpid());
        fclose(fp);
    }

    { /* initialize SSL_CTXs for session resumption and ticket-based resumption (also starts memcached client threads for the
         purpose) */
        size_t i, j;
        H2O_VECTOR(SSL_CTX *) ssl_contexts = {NULL};
        for (i = 0; i != conf.num_listeners; ++i) {
            for (j = 0; j != conf.listeners[i]->ssl.size; ++j) {
                h2o_vector_reserve(NULL, &ssl_contexts, ssl_contexts.size + 1);
                ssl_contexts.entries[ssl_contexts.size++] = conf.listeners[i]->ssl.entries[j]->ctx;
            }
        }
        ssl_setup_session_resumption(ssl_contexts.entries, ssl_contexts.size);
        free(ssl_contexts.entries);
    }

    /* all setup should be complete by now */

    /* replace STDIN to an closed pipe */
    {
        int fds[2];
        if (pipe(fds) != 0) {
            perror("pipe failed");
            return EX_OSERR;
        }
        close(fds[1]);
        dup2(fds[0], 0);
        close(fds[0]);
    }

    /* redirect STDOUT and STDERR to error_log (if specified) */
    if (error_log_fd != -1) {
        if (dup2(error_log_fd, 1) == -1 || dup2(error_log_fd, 2) == -1) {
            perror("dup(2) failed");
            return EX_OSERR;
        }
        close(error_log_fd);
        error_log_fd = -1;
    }

    fprintf(stderr, "h2o server (pid:%d) is ready to serve requests\n", (int)getpid());

    assert(conf.num_threads != 0);

    /* start the threads */
    conf.threads = alloca(sizeof(conf.threads[0]) * conf.num_threads);
    h2o_barrier_init(&conf.startup_sync_barrier, conf.num_threads);
    size_t i;
    for (i = 1; i != conf.num_threads; ++i) {
        pthread_t tid;
        h2o_multithread_create_thread(&tid, NULL, run_loop, (void *)i);
    }

    /* this thread becomes the first thread */
    run_loop((void *)0);

    /* notreached */
    return 0;
}